

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPifdef(TPpContext *this,int defined,TPpToken *ppToken)

{
  int iVar1;
  uint uVar2;
  MacroSymbol *pMVar3;
  char *pcVar4;
  
  iVar1 = scanToken(this,ppToken);
  if ((this->ifdepth < 0x42) && (this->elsetracker < 0x42)) {
    this->elsetracker = this->elsetracker + 1;
    this->ifdepth = this->ifdepth + 1;
    if (iVar1 == 0xa2) {
      iVar1 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
      pMVar3 = lookupMacroDef(this,iVar1);
      iVar1 = scanToken(this,ppToken);
      if (iVar1 == 10) {
        iVar1 = 10;
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,
                   "unexpected tokens following #ifdef directive - expected a newline","#ifdef","");
        while ((iVar1 != -1 && (iVar1 != 10))) {
          iVar1 = scanToken(this,ppToken);
        }
      }
      uVar2 = 0;
      if (pMVar3 != (MacroSymbol *)0x0) {
        uVar2 = (uint)((pMVar3->field_0x48 & 4) == 0);
      }
      if (uVar2 != defined) {
        iVar1 = CPPelse(this,1,ppToken);
        return iVar1;
      }
    }
    else {
      if (defined == 0) {
        pcVar4 = "#ifndef";
      }
      else {
        pcVar4 = "#ifdef";
      }
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must be followed by macro name",pcVar4,"");
    }
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"maximum nesting depth exceeded","#ifdef","");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPpContext::CPPifdef(int defined, TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (ifdepth > maxIfNesting || elsetracker > maxIfNesting) {
        parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#ifdef", "");
        return EndOfInput;
    } else {
        elsetracker++;
        ifdepth++;
    }

    if (token != PpAtomIdentifier) {
        if (defined)
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifdef", "");
        else
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifndef", "");
    } else {
        MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
        token = scanToken(ppToken);
        if (token != '\n') {
            parseContext.ppError(ppToken->loc, "unexpected tokens following #ifdef directive - expected a newline", "#ifdef", "");
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);
        }
        if (((macro != nullptr && !macro->undef) ? 1 : 0) != defined)
            token = CPPelse(1, ppToken);
    }

    return token;
}